

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-wizard.c
# Opt level: O3

void wiz_display_item(object *obj,_Bool all,player *p)

{
  byte bVar1;
  byte bVar2;
  short sVar3;
  uint uVar4;
  int16_t iVar5;
  wchar_t wVar6;
  wchar_t wVar7;
  wchar_t wVar8;
  char *pcVar9;
  void *p_00;
  int *piVar10;
  long lVar11;
  char cVar12;
  undefined7 in_register_00000031;
  object *obj_00;
  long lVar13;
  ulong uVar14;
  long lVar15;
  bitflag f [6];
  char buf [256];
  bitflag local_13e [6];
  char local_138 [43];
  ushort local_10d;
  
  if ((int)CONCAT71(in_register_00000031,all) == 0) {
    object_flags_known(obj,local_13e);
  }
  else {
    object_flags(obj,local_13e);
  }
  Term_clear();
  object_desc(local_138,0x100,obj,99,p);
  prt(local_138,L'\x02',L'\0');
  bVar1 = obj->dd;
  bVar2 = obj->ds;
  if (all) {
    wVar6 = object_to_hit(obj);
    wVar7 = object_to_dam(obj);
    obj_00 = obj;
  }
  else {
    wVar6 = object_to_hit(obj->known);
    wVar7 = object_to_dam(obj->known);
    obj_00 = obj->known;
  }
  sVar3 = obj->ac;
  wVar8 = object_to_ac(obj_00);
  pcVar9 = format("combat = (%dd%d) (%+d,%+d) [%d,%+d]",(ulong)bVar1,(ulong)bVar2,(ulong)(uint)wVar6
                  ,(ulong)(uint)wVar7,(ulong)(uint)(int)sVar3,wVar8);
  prt(pcVar9,L'\x04',L'\0');
  uVar4 = obj->kind->kidx;
  bVar1 = obj->tval;
  bVar2 = obj->sval;
  iVar5 = object_weight_one(obj);
  pcVar9 = format("kind = %-5lu  tval = %-5d  sval = %-5d  wgt = %-3d     timeout = %-d",
                  (ulong)uVar4,(ulong)bVar1,(ulong)bVar2,(ulong)(uint)(int)iVar5,
                  (ulong)(uint)(int)obj->timeout);
  prt(pcVar9,L'\x05',L'\0');
  bVar1 = obj->number;
  sVar3 = obj->pval;
  if (obj->ego == (ego_item *)0x0) {
    uVar14 = 0xffffffffffffffff;
  }
  else {
    uVar14 = (ulong)obj->ego->eidx;
  }
  wVar6 = object_value(obj,L'\x01');
  lVar13 = (long)wVar6;
  lVar15 = 0;
  pcVar9 = format("number = %-3d  pval = %-5d  name1 = %-4ld  egoidx = %-4ld  cost = %ld",
                  (ulong)bVar1,(ulong)(uint)(int)sVar3);
  prt(pcVar9,L'\x06',L'\0');
  builtin_strncpy(local_138,"+------------------FLAGS-------------------",0x2b);
  local_10d = 0x2b;
  prt(local_138,L'\x10',L'\0');
  p_00 = mem_zalloc(0x2c);
  do {
    piVar10 = &wiz_display_item_flagLabels_rel;
    lVar11 = 0;
    do {
      cVar12 = ' ';
      if ((*(char *)((long)p_00 + lVar11) == '\0') &&
         (cVar12 = *(char *)((long)&wiz_display_item_flagLabels_rel + lVar15 + *piVar10),
         cVar12 == '\0')) {
        *(undefined1 *)((long)p_00 + lVar11) = 1;
        cVar12 = ' ';
      }
      local_138[lVar11] = cVar12;
      lVar11 = lVar11 + 1;
      piVar10 = piVar10 + 1;
    } while (lVar11 != 0x2c);
    local_10d = local_10d & 0xff;
    prt(local_138,(int)lVar15 + L'\x11',L'\0');
    wVar8 = (wchar_t)lVar13;
    wVar7 = (wchar_t)uVar14;
    wVar6 = (wchar_t)lVar11;
    lVar15 = lVar15 + 1;
  } while (lVar15 != 5);
  mem_free(p_00);
  prt_binary(local_13e,L'\x16',L'*',wVar6,wVar7,wVar8);
  if (obj->known != (object *)0x0) {
    prt_binary(obj->known->flags,L'\x17',L'+',wVar6,wVar7,wVar8);
  }
  return;
}

Assistant:

static void wiz_display_item(const struct object *obj, bool all,
		const struct player *p)
{
	static const char *flagLabels[] = {
		#define OF(a, b) b,
		#include "list-object-flags.h"
		#undef OF
	};
	int j = 0, i, k, nflg;
	bitflag f[OF_SIZE];
	char buf[256];
	bool *labelsDone;

	/* Extract the flags. */
	if (all) {
		object_flags(obj, f);
	} else {
		object_flags_known(obj, f);
	}

	/* Clear screen. */
	Term_clear();

	/* Describe fully */
	object_desc(buf, sizeof(buf), obj,
		ODESC_PREFIX | ODESC_FULL | ODESC_SPOIL, p);

	prt(buf, 2, j);

	prt(format("combat = (%dd%d) (%+d,%+d) [%d,%+d]",
		obj->dd, obj->ds, object_to_hit(all ? obj : obj->known),
		object_to_dam(all ? obj : obj->known), obj->ac,
		object_to_ac(all ? obj : obj->known)), 4, j);

	prt(format("kind = %-5lu  tval = %-5d  sval = %-5d  wgt = %-3d     timeout = %-d",
		(unsigned long)obj->kind->kidx, obj->tval, obj->sval,
		object_weight_one(obj), obj->timeout), 5, j);

	prt(format("number = %-3d  pval = %-5d  name1 = %-4ld  egoidx = %-4ld  cost = %ld",
		obj->number, obj->pval,
		obj->artifact ? (long)obj->artifact->aidx : 0L,
		obj->ego ? (long)obj->ego->eidx : -1L,
		(long)object_value(obj, 1)), 6, j);

	nflg = MIN(OF_MAX - FLAG_START, 80);

	/* Set up header line. */
	if (nflg >= 6) {
		buf[0] = '+';
		k = (nflg - 6) / 2;
		for (i = 1; i < k; ++i) {
			buf[i] = '-';
		}
	} else {
		k = 0;
	}
	buf[k] = 'F';
	buf[k + 1] = 'L';
	buf[k + 2] = 'A';
	buf[k + 3] = 'G';
	buf[k + 4] = 'S';
	for (i = k + 5; i < nflg - 1; ++i) {
		buf[i] = '-';
	}
	if (nflg >= 7) {
		buf[nflg - 1] = '+';
		buf[nflg] = '\0';
	} else {
		buf[k + 5] = '\0';
	}
	prt(buf, 16, j);

	/* Display first five letters of flag labels vertically. */
	labelsDone = mem_zalloc(nflg * sizeof(*labelsDone));
	for (k = 0; k < 5; ++k) {
		for (i = 0; i < nflg; ++i) {
			if (labelsDone[i]) {
				buf[i] = ' ';
			} else if (flagLabels[i][k] == '\0') {
				labelsDone[i] = true;
				buf[i] = ' ';
			} else {
				buf[i] = flagLabels[i][k];
			}
		}
		buf[nflg] = '\0';
		prt(buf, 17 + k, j);
	}
	mem_free(labelsDone);

	prt_binary(f, 0, 22, j, L'*', nflg);
	if (obj->known) {
		prt_binary(obj->known->flags, 0, 23, j, L'+', nflg);
	}
}